

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unicodeAddExceptions(unicode_tokenizer *p,int bAlnum,char *zIn,int nIn)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte *pbVar9;
  uint uVar10;
  byte *pbVar11;
  byte *pbVar12;
  int local_44;
  
  pbVar9 = (byte *)(zIn + (uint)nIn);
  local_44 = 0;
  pbVar12 = (byte *)zIn;
  while (pbVar12 < pbVar9) {
    bVar1 = *pbVar12;
    uVar10 = (uint)bVar1;
    pbVar11 = pbVar12 + 1;
    pbVar12 = pbVar11;
    if (0xbf < bVar1) {
      uVar2 = (uint)""[bVar1 - 0xc0];
      for (; (pbVar12 = pbVar9, pbVar11 != pbVar9 &&
             (pbVar12 = pbVar11, (*pbVar11 & 0xffffffc0) == 0x80)); pbVar11 = pbVar11 + 1) {
        uVar2 = uVar2 << 6 | *pbVar11 & 0x3f;
      }
      uVar10 = uVar2;
      if ((uVar2 & 0xfffff800) == 0xd800) {
        uVar10 = 0xfffd;
      }
      if (uVar2 < 0x80) {
        uVar10 = 0xfffd;
      }
      if ((uVar2 & 0xfffffffe) == 0xfffe) {
        uVar10 = 0xfffd;
      }
    }
    iVar3 = sqlite3FtsUnicodeIsalnum(uVar10);
    if (iVar3 != bAlnum) {
      iVar3 = sqlite3FtsUnicodeIsdiacritic(uVar10);
      local_44 = local_44 + (uint)(iVar3 == 0);
    }
  }
  if (local_44 == 0) {
LAB_0019d75c:
    iVar3 = 0;
  }
  else {
    piVar5 = (int *)sqlite3_realloc64(p->aiException,((long)local_44 + (long)p->nException) * 4);
    if (piVar5 != (int *)0x0) {
      uVar10 = p->nException;
      do {
        uVar6 = 0;
        if (0 < (int)uVar10) {
          uVar6 = (ulong)uVar10;
        }
        do {
          if (pbVar9 <= zIn) {
            p->aiException = piVar5;
            p->nException = uVar10;
            goto LAB_0019d75c;
          }
          bVar1 = *zIn;
          uVar2 = (uint)bVar1;
          pbVar12 = (byte *)zIn + 1;
          zIn = (char *)pbVar12;
          if (0xbf < bVar1) {
            uVar4 = (uint)""[bVar1 - 0xc0];
            for (; (zIn = (char *)pbVar9, pbVar12 != pbVar9 &&
                   (zIn = (char *)pbVar12, (*pbVar12 & 0xffffffc0) == 0x80)); pbVar12 = pbVar12 + 1)
            {
              uVar4 = uVar4 << 6 | *pbVar12 & 0x3f;
            }
            uVar2 = uVar4;
            if ((uVar4 & 0xfffff800) == 0xd800) {
              uVar2 = 0xfffd;
            }
            if (uVar4 < 0x80) {
              uVar2 = 0xfffd;
            }
            if ((uVar4 & 0xfffffffe) == 0xfffe) {
              uVar2 = 0xfffd;
            }
          }
          iVar3 = sqlite3FtsUnicodeIsalnum(uVar2);
        } while ((iVar3 == bAlnum) || (iVar3 = sqlite3FtsUnicodeIsdiacritic(uVar2), iVar3 != 0));
        uVar4 = 0;
        if (0 < (int)uVar10) {
          uVar4 = uVar10;
        }
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          if ((int)uVar2 <= piVar5[uVar7]) {
            uVar4 = (uint)uVar7;
            break;
          }
        }
        for (lVar8 = (long)(int)uVar10; (int)uVar4 < lVar8; lVar8 = lVar8 + -1) {
          piVar5[lVar8] = piVar5[lVar8 + -1];
        }
        piVar5[(int)uVar4] = uVar2;
        uVar10 = uVar10 + 1;
      } while( true );
    }
    iVar3 = 7;
  }
  return iVar3;
}

Assistant:

static int unicodeAddExceptions(
  unicode_tokenizer *p,           /* Tokenizer to add exceptions to */
  int bAlnum,                     /* Replace Isalnum() return value with this */
  const char *zIn,                /* Array of characters to make exceptions */
  int nIn                         /* Length of z in bytes */
){
  const unsigned char *z = (const unsigned char *)zIn;
  const unsigned char *zTerm = &z[nIn];
  unsigned int iCode;
  int nEntry = 0;

  assert( bAlnum==0 || bAlnum==1 );

  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    assert( (sqlite3FtsUnicodeIsalnum((int)iCode) & 0xFFFFFFFE)==0 );
    if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum 
     && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0 
    ){
      nEntry++;
    }
  }

  if( nEntry ){
    int *aNew;                    /* New aiException[] array */
    int nNew;                     /* Number of valid entries in array aNew[] */

    aNew = sqlite3_realloc64(p->aiException,(p->nException+nEntry)*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    nNew = p->nException;

    z = (const unsigned char *)zIn;
    while( z<zTerm ){
      READ_UTF8(z, zTerm, iCode);
      if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum 
       && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
      ){
        int i, j;
        for(i=0; i<nNew && aNew[i]<(int)iCode; i++);
        for(j=nNew; j>i; j--) aNew[j] = aNew[j-1];
        aNew[i] = (int)iCode;
        nNew++;
      }
    }
    p->aiException = aNew;
    p->nException = nNew;
  }

  return SQLITE_OK;
}